

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# probe.c
# Opt level: O3

float getRadius(int at,int useCOScale)

{
  float fVar1;
  float fVar2;
  float fVar3;
  
  fVar1 = CORadScale;
  fVar3 = RadScaleFactor;
  if (ImplicitH == '\x01') {
    fVar2 = getImplRad(at);
  }
  else {
    fVar2 = getExplRad(at);
  }
  if (useCOScale != 0) {
    fVar3 = fVar3 * fVar1;
  }
  return fVar2 * fVar3 + RadScaleOffset;
}

Assistant:

float getRadius(int at, int useCOScale)
{
   float rad = 0.0, sf = RadScaleFactor;

   if (useCOScale){ sf *= CORadScale; }

   if (ImplicitH) { rad = getImplRad(at); }
   else           { rad = getExplRad(at); }

   return (rad*sf) + RadScaleOffset;
}